

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_quality.hpp
# Opt level: O2

void __thiscall
Omega_h::MetricElementQualities<2,_2>::MetricElementQualities
          (MetricElementQualities<2,_2> *this,Mesh *mesh,Reals *metrics_in)

{
  Omega_h::Mesh::coords((Mesh *)this);
  Write<double>::Write(&(this->metrics).write_,&metrics_in->write_);
  return;
}

Assistant:

MetricElementQualities(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}